

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ImplementsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplementsClauseSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&>
          (BumpAllocator *this,Token *args,SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1)

{
  Token keyword;
  ImplementsClauseSyntax *this_00;
  
  this_00 = (ImplementsClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplementsClauseSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ImplementsClauseSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  slang::syntax::ImplementsClauseSyntax::ImplementsClauseSyntax(this_00,keyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }